

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cpp
# Opt level: O3

void BaseHttp_Init(TFileStream *pStream)

{
  byte *pbVar1;
  
  pStream->BaseOpen = BaseHttp_Open;
  pStream->BaseRead = BaseHttp_Read;
  pStream->BaseGetSize = BaseFile_GetSize;
  pStream->BaseGetPos = BaseFile_GetPos;
  pStream->BaseClose = BaseHttp_Close;
  pbVar1 = (byte *)((long)&pStream->dwFlags + 1);
  *pbVar1 = *pbVar1 | 1;
  return;
}

Assistant:

static void BaseHttp_Init(TFileStream * pStream)
{
    // Supply the stream functions
    pStream->BaseOpen    = BaseHttp_Open;
    pStream->BaseRead    = BaseHttp_Read;
    pStream->BaseGetSize = BaseFile_GetSize;    // Reuse BaseFile function
    pStream->BaseGetPos  = BaseFile_GetPos;     // Reuse BaseFile function
    pStream->BaseClose   = BaseHttp_Close;

    // HTTP files are read-only
    pStream->dwFlags |= STREAM_FLAG_READ_ONLY;
}